

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

void deleteBasisEntries(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
                       bool *deleted_basic,bool *deleted_nonbasic,
                       HighsIndexCollection *index_collection,HighsInt entry_dim)

{
  pointer pHVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool *pbVar5;
  int iVar6;
  HighsInt keep_to_entry;
  HighsInt current_set_entry;
  HighsInt keep_from_entry;
  HighsInt delete_to_entry;
  HighsInt delete_from_entry;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt local_54;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *local_50;
  HighsInt local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_50 = status;
  limits(index_collection,&local_34,&local_38);
  if (local_34 <= local_38) {
    local_54 = -1;
    local_48 = 0;
    iVar3 = 0;
    *deleted_basic = false;
    *deleted_nonbasic = false;
    iVar6 = local_34;
    while( true ) {
      updateOutInIndex(index_collection,&local_3c,&local_40,&local_44,&local_54,&local_48);
      if (iVar6 == local_34) {
        iVar3 = local_3c;
      }
      if (local_3c <= local_40) {
        pHVar1 = (local_50->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = 0;
        do {
          pbVar5 = deleted_nonbasic;
          if (pHVar1[lVar4 + local_3c] == kBasic) {
            pbVar5 = deleted_basic;
          }
          *pbVar5 = true;
          lVar4 = lVar4 + 1;
        } while ((local_40 - local_3c) + 1 != (int)lVar4);
      }
      if (entry_dim + -1 <= local_40) break;
      if (local_44 <= local_54) {
        pHVar1 = (local_50->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = 0;
        do {
          pHVar1[lVar4 + iVar3] = pHVar1[lVar4 + local_44];
          lVar4 = lVar4 + 1;
        } while ((local_54 - local_44) + 1 != (int)lVar4);
        iVar3 = iVar3 + (int)lVar4;
      }
      if ((entry_dim + -1 <= local_54) || (bVar2 = local_38 <= iVar6, iVar6 = iVar6 + 1, bVar2))
      break;
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(local_50,(long)iVar3);
  }
  return;
}

Assistant:

void deleteBasisEntries(std::vector<HighsBasisStatus>& status,
                        bool& deleted_basic, bool& deleted_nonbasic,
                        const HighsIndexCollection& index_collection,
                        const HighsInt entry_dim) {
  assert(ok(index_collection));
  assert(static_cast<size_t>(entry_dim) == status.size());
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_entry;
  HighsInt delete_to_entry;
  HighsInt keep_from_entry;
  HighsInt keep_to_entry = -1;
  HighsInt current_set_entry = 0;
  HighsInt new_num_entry = 0;
  deleted_basic = false;
  deleted_nonbasic = false;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_entry, delete_to_entry,
                     keep_from_entry, keep_to_entry, current_set_entry);
    // Account for the initial entries being kept
    if (k == from_k) new_num_entry = delete_from_entry;
    // Identify whether a basic or a nonbasic entry has been deleted
    for (HighsInt entry = delete_from_entry; entry <= delete_to_entry;
         entry++) {
      if (status[entry] == HighsBasisStatus::kBasic) {
        deleted_basic = true;
      } else {
        deleted_nonbasic = true;
      }
    }
    if (delete_to_entry >= entry_dim - 1) break;
    for (HighsInt entry = keep_from_entry; entry <= keep_to_entry; entry++) {
      status[new_num_entry] = status[entry];
      new_num_entry++;
    }
    if (keep_to_entry >= entry_dim - 1) break;
  }
  status.resize(new_num_entry);
}